

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_2,_2>,_tcu::Vector<double,_2>,_tcu::Vector<double,_2>_>::call
          (binary<tcu::Matrix<double,_2,_2>,_tcu::Vector<double,_2>,_tcu::Vector<double,_2>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  GLdouble *data;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  (*(code *)(this->super_binaryBase).super_functionObject.m_p_function)(&local_38);
  *(undefined8 *)result_dst = local_38;
  *(undefined8 *)((long)result_dst + 8) = uStack_30;
  *(undefined8 *)((long)result_dst + 0x10) = local_28;
  *(undefined8 *)((long)result_dst + 0x18) = uStack_20;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}